

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingUtils.h
# Opt level: O0

bool Assimp::SkipSpacesAndLineEnd<char>(char *in,char **out)

{
  bool bVar1;
  char **out_local;
  char *in_local;
  
  out_local = (char **)in;
  while( true ) {
    bVar1 = true;
    if (((*(char *)out_local != ' ') && (bVar1 = true, *(char *)out_local != '\t')) &&
       (bVar1 = true, *(char *)out_local != '\r')) {
      bVar1 = *(char *)out_local == '\n';
    }
    if (!bVar1) break;
    out_local = (char **)((long)out_local + 1);
  }
  *out = (char *)out_local;
  return *(char *)out_local != '\0';
}

Assistant:

AI_FORCE_INLINE
bool SkipSpacesAndLineEnd( const char_t* in, const char_t** out) {
    while( *in == ( char_t )' ' || *in == ( char_t )'\t' || *in == ( char_t )'\r' || *in == ( char_t )'\n' ) {
        ++in;
    }
    *out = in;
    return *in != '\0';
}